

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

uint64_t __thiscall mkvmuxer::ContentEncoding::EncryptionSize(ContentEncoding *this)

{
  uint64_t uVar1;
  uint64 uVar2;
  uint64 uVar3;
  ContentEncAESSettings *in_RDI;
  uint64_t encryption_size;
  uint64_t aes_size;
  uint64 in_stack_ffffffffffffffd8;
  uint64 in_stack_ffffffffffffffe8;
  
  uVar1 = ContentEncAESSettings::Size(in_RDI);
  uVar2 = EbmlElementSize(in_stack_ffffffffffffffe8,(uint8 *)in_RDI,in_stack_ffffffffffffffd8);
  uVar3 = EbmlElementSize((uint64)in_RDI,in_stack_ffffffffffffffd8);
  return uVar3 + uVar2 + uVar1;
}

Assistant:

uint64_t ContentEncoding::EncryptionSize() const {
  const uint64_t aes_size = enc_aes_settings_.Size();

  uint64_t encryption_size = EbmlElementSize(libwebm::kMkvContentEncKeyID,
                                             enc_key_id_, enc_key_id_length_);
  encryption_size += EbmlElementSize(libwebm::kMkvContentEncAlgo,
                                     static_cast<uint64>(enc_algo_));

  return encryption_size + aes_size;
}